

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

cio_error cio_http_server_init
                    (cio_http_server *server,cio_eventloop *loop,
                    cio_http_server_configuration *config)

{
  undefined1 auVar1 [16];
  uint uVar2;
  cio_address_family family_00;
  bool bVar3;
  cio_error err;
  cio_address_family family;
  int ret;
  uint32_t keep_alive;
  cio_http_server_configuration *config_local;
  cio_eventloop *loop_local;
  cio_http_server *server_local;
  
  bVar3 = true;
  if ((((server != (cio_http_server *)0x0) &&
       (bVar3 = true, config != (cio_http_server_configuration *)0x0)) &&
      (bVar3 = true, loop != (cio_eventloop *)0x0)) &&
     (((bVar3 = true, config->alloc_client != (cio_alloc_client_t)0x0 &&
       (bVar3 = true, config->free_client != (cio_free_client_t)0x0)) &&
      ((bVar3 = true, config->read_header_timeout_ns != 0 &&
       (bVar3 = true, config->read_body_timeout_ns != 0)))))) {
    bVar3 = config->response_timeout_ns == 0;
  }
  if (bVar3) {
    server_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    server->loop = loop;
    server->alloc_client = config->alloc_client;
    server->free_client = config->free_client;
    server->first_location = (cio_http_location *)0x0;
    server->num_handlers = 0;
    server->on_error = config->on_error;
    server->read_header_timeout_ns = config->read_header_timeout_ns;
    server->read_body_timeout_ns = config->read_body_timeout_ns;
    server->response_timeout_ns = config->response_timeout_ns;
    server->close_hook = (cio_http_server_close_hook_t)0x0;
    memcpy(server,config,0x74);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = config->read_header_timeout_ns;
    uVar2 = snprintf(server->keepalive_header,0x21,"Keep-Alive: timeout=%u\r\n",
                     (ulong)SUB164(auVar1 / ZEXT816(1000000000),0));
    if (uVar2 < 0x20) {
      family_00 = cio_socket_address_get_family(&server->endpoint);
      server_local._4_4_ =
           cio_server_socket_init
                     (&server->server_socket,server->loop,5,family_00,server->alloc_client,
                      server->free_client,config->close_timeout_ns,server_socket_closed);
      if (server_local._4_4_ == CIO_SUCCESS) {
        if ((config->use_tcp_fastopen & 1U) == 0) {
          server_local._4_4_ = CIO_SUCCESS;
        }
        else {
          server_local._4_4_ = cio_server_socket_set_tcp_fast_open(&server->server_socket,true);
        }
      }
    }
    else {
      server_local._4_4_ = CIO_NO_BUFFER_SPACE;
    }
  }
  return server_local._4_4_;
}

Assistant:

enum cio_error cio_http_server_init(struct cio_http_server *server,
                                    struct cio_eventloop *loop,
                                    const struct cio_http_server_configuration *config)
{
	if (cio_unlikely((server == NULL) || (config == NULL) ||
	                 (loop == NULL) || (config->alloc_client == NULL) || (config->free_client == NULL) ||
	                 (config->read_header_timeout_ns == 0) || (config->read_body_timeout_ns == 0) || (config->response_timeout_ns == 0))) {
		return CIO_INVALID_ARGUMENT;
	}

	server->loop = loop;
	server->alloc_client = config->alloc_client;
	server->free_client = config->free_client;
	server->first_location = NULL;
	server->num_handlers = 0;
	server->on_error = config->on_error;
	server->read_header_timeout_ns = config->read_header_timeout_ns;
	server->read_body_timeout_ns = config->read_body_timeout_ns;
	server->response_timeout_ns = config->response_timeout_ns;
	server->close_hook = NULL;
	memcpy(&server->endpoint, &config->endpoint, sizeof(config->endpoint));

	uint32_t keep_alive = (uint32_t)(config->read_header_timeout_ns / NANO_SECONDS_IN_SECONDS);
	int ret = snprintf(server->keepalive_header, sizeof(server->keepalive_header), "Keep-Alive: timeout=%" PRIu32 "\r\n", keep_alive);
	if (cio_unlikely((ret < 0) || ((size_t)ret >= sizeof(server->keepalive_header) - 1))) {
		return CIO_NO_BUFFER_SPACE;
	}

	enum cio_address_family family = cio_socket_address_get_family(&server->endpoint);
	enum cio_error err = cio_server_socket_init(&server->server_socket, server->loop, DEFAULT_BACKLOG, family, server->alloc_client, server->free_client, config->close_timeout_ns, server_socket_closed);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	if (config->use_tcp_fastopen) {
		return cio_server_socket_set_tcp_fast_open(&server->server_socket, true);
	}

	return CIO_SUCCESS;
}